

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.h
# Opt level: O0

void __thiscall FBX::Settings::Settings(Settings *this,Node *node)

{
  double dVar1;
  Node *pNVar2;
  int iVar3;
  int iVar4;
  Vector3 VVar5;
  Vector3 local_238;
  allocator<char> local_229;
  string local_228;
  double local_208;
  allocator<char> local_1f9;
  string local_1f8;
  double local_1d8;
  allocator<char> local_1c9;
  string local_1c8;
  undefined8 local_1a8;
  float local_1a0;
  int local_198;
  allocator<char> local_191;
  string local_190;
  int local_170;
  allocator<char> local_169;
  string local_168;
  undefined8 local_148;
  float local_140;
  int local_138;
  allocator<char> local_131;
  string local_130;
  int local_110;
  allocator<char> local_109;
  string local_108;
  undefined8 local_e8;
  float local_e0;
  int local_d8;
  allocator<char> local_d1;
  string local_d0;
  int local_b0;
  allocator<char> local_a9;
  string local_a8;
  undefined8 local_88;
  float local_80;
  int local_78;
  allocator<char> local_71;
  string local_70;
  int local_50 [5];
  allocator<char> local_39;
  string local_38;
  Node *local_18;
  Node *node_local;
  Settings *this_local;
  
  local_18 = node;
  node_local = (Node *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"UpAxis",&local_39);
  local_50[0] = 2;
  iVar3 = getProperty<int>(node,&local_38,local_50);
  pNVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"UpAxisSign",&local_71);
  local_78 = 1;
  iVar4 = getProperty<int>(pNVar2,&local_70,&local_78);
  VVar5 = parseAxis(iVar3,iVar4);
  local_80 = VVar5.z;
  local_88 = VVar5._0_8_;
  (this->upAxis).z = local_80;
  (this->upAxis).x = (float)(int)local_88;
  (this->upAxis).y = (float)(int)((ulong)local_88 >> 0x20);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pNVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"FrontAxis",&local_a9);
  local_b0 = 2;
  iVar3 = getProperty<int>(pNVar2,&local_a8,&local_b0);
  pNVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"FrontAxisSign",&local_d1);
  local_d8 = 1;
  iVar4 = getProperty<int>(pNVar2,&local_d0,&local_d8);
  VVar5 = parseAxis(iVar3,iVar4);
  local_e0 = VVar5.z;
  local_e8 = VVar5._0_8_;
  (this->frontAxis).z = local_e0;
  (this->frontAxis).x = (float)(int)local_e8;
  (this->frontAxis).y = (float)(int)((ulong)local_e8 >> 0x20);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pNVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"CoordAxis",&local_109);
  local_110 = 2;
  iVar3 = getProperty<int>(pNVar2,&local_108,&local_110);
  pNVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"CoordAxisSign",&local_131);
  local_138 = 1;
  iVar4 = getProperty<int>(pNVar2,&local_130,&local_138);
  VVar5 = parseAxis(iVar3,iVar4);
  local_140 = VVar5.z;
  local_148 = VVar5._0_8_;
  (this->coordAxis).z = local_140;
  (this->coordAxis).x = (float)(int)local_148;
  (this->coordAxis).y = (float)(int)((ulong)local_148 >> 0x20);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  pNVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"OriginalUpAxis",&local_169);
  local_170 = 2;
  iVar3 = getProperty<int>(pNVar2,&local_168,&local_170);
  pNVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"OriginalUpAxisSign",&local_191);
  local_198 = 1;
  iVar4 = getProperty<int>(pNVar2,&local_190,&local_198);
  VVar5 = parseAxis(iVar3,iVar4);
  local_1a0 = VVar5.z;
  local_1a8 = VVar5._0_8_;
  (this->originalUpAxis).z = local_1a0;
  (this->originalUpAxis).x = (float)(int)local_1a8;
  (this->originalUpAxis).y = (float)(int)((ulong)local_1a8 >> 0x20);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  pNVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"UnitScaleFactor",&local_1c9);
  local_1d8 = 1.0;
  dVar1 = getProperty<double>(pNVar2,&local_1c8,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  pNVar2 = local_18;
  this->unitScaleFactor = dVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"OriginalUnitScaleFactor",&local_1f9);
  local_208 = 1.0;
  dVar1 = getProperty<double>(pNVar2,&local_1f8,&local_208);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  pNVar2 = local_18;
  this->originalUnitScaleFactor = dVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"AmbientColor",&local_229)
  ;
  local_238.z = 0.0;
  local_238.x = 0.0;
  local_238.y = 0.0;
  Vector3::Vector3(&local_238);
  VVar5 = getProperty(pNVar2,&local_228,&local_238);
  (this->ambientColor).x = (float)(int)VVar5._0_8_;
  (this->ambientColor).y = (float)(int)((ulong)VVar5._0_8_ >> 0x20);
  (this->ambientColor).z = VVar5.z;
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  return;
}

Assistant:

explicit Settings(const Node &node)
                : upAxis(parseAxis(getProperty<int32_t>(node, "UpAxis", 2),
                                   getProperty<int32_t>(node, "UpAxisSign", 1))),
                  frontAxis(parseAxis(getProperty<int32_t>(node, "FrontAxis", 2),
                                      getProperty<int32_t>(node, "FrontAxisSign", 1))),
                  coordAxis(parseAxis(getProperty<int32_t>(node, "CoordAxis", 2),
                                      getProperty<int32_t>(node, "CoordAxisSign", 1))),
                  originalUpAxis(parseAxis(getProperty<int32_t>(node, "OriginalUpAxis", 2),
                                           getProperty<int32_t>(node, "OriginalUpAxisSign", 1))),
                  unitScaleFactor(getProperty<double>(node, "UnitScaleFactor", 1.0)),
                  originalUnitScaleFactor(getProperty<double>(node, "OriginalUnitScaleFactor", 1.0)),
                  ambientColor(getProperty(node, "AmbientColor", {})) {}